

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O2

void __thiscall
GslSpan_FromPointerPointerConstructor_Test::~GslSpan_FromPointerPointerConstructor_Test
          (GslSpan_FromPointerPointerConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromPointerPointerConstructor) {
    int arr[4] = {1, 2, 3, 4};

    {
        span<int> s{&arr[0], &arr[2]};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int, 2> s{&arr[0], &arr[2]};
        EXPECT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        span<int> s{&arr[0], &arr[0]};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        span<int, 0> s{&arr[0], &arr[0]};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    {
        int * p = nullptr;
        span<int> s{p, p};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
    {
        int * p = nullptr;
        span<int, 0> s{p, p};
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }

    {
        auto s = make_span (&arr[0], &arr[2]);
        ASSERT_EQ (s.length (), 2);
        EXPECT_EQ (s.data (), &arr[0]);
        EXPECT_EQ (s[0], 1);
        EXPECT_EQ (s[1], 2);
    }
    {
        auto s = make_span (&arr[0], &arr[0]);
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    {
        int * p = nullptr;
        auto s = make_span (p, p);
        EXPECT_EQ (s.length (), 0);
        EXPECT_EQ (s.data (), nullptr);
    }
}